

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void relaxSemiVariables(HighsLp *lp,bool *made_semi_variable_mods)

{
  int local_2c;
  
  *made_semi_variable_mods = false;
  if ((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    for (local_2c = 0; local_2c < lp->num_col_; local_2c = local_2c + 1) {
      if (((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start[local_2c] & ~kInteger) == kSemiContinuous) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&(lp->mods_).save_relaxed_semi_variable_lower_bound_index,&local_2c);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&(lp->mods_).save_relaxed_semi_variable_lower_bound_value,
                   (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_2c);
        (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[local_2c] = 0.0;
      }
    }
    *made_semi_variable_mods =
         (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
         (lp->mods_).save_relaxed_semi_variable_lower_bound_index.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void relaxSemiVariables(HighsLp& lp, bool& made_semi_variable_mods) {
  // When solving relaxation, semi-variables are continuous between 0
  // and their upper bound, so have to modify the lower bound to be
  // zero
  made_semi_variable_mods = false;
  if (!lp.integrality_.size()) return;
  assert((HighsInt)lp.integrality_.size() == lp.num_col_);
  std::vector<HighsInt>& relaxed_semi_variable_lower_index =
      lp.mods_.save_relaxed_semi_variable_lower_bound_index;
  std::vector<double>& relaxed_semi_variable_lower_value =
      lp.mods_.save_relaxed_semi_variable_lower_bound_value;
  assert(relaxed_semi_variable_lower_index.size() == 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      relaxed_semi_variable_lower_index.push_back(iCol);
      relaxed_semi_variable_lower_value.push_back(lp.col_lower_[iCol]);
      lp.col_lower_[iCol] = 0;
    }
  }
  made_semi_variable_mods = relaxed_semi_variable_lower_index.size() > 0;
}